

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KcpWithTcpClient.cpp
# Opt level: O0

void __thiscall sznet::net::KcpWithTcpClient::~KcpWithTcpClient(KcpWithTcpClient *this)

{
  EventLoop *pEVar1;
  bool bVar2;
  LogLevel LVar3;
  LogStream *pLVar4;
  self *psVar5;
  Connector *p;
  long lVar6;
  element_type *this_00;
  element_type *this_01;
  EventLoop *pEVar7;
  element_type *peVar8;
  SourceFile file;
  SourceFile file_00;
  SourceFile file_01;
  TimerId TVar9;
  undefined1 local_3180 [12];
  Logger local_3170;
  code *local_21a0;
  undefined8 local_2198;
  type local_2190;
  Functor local_2150;
  EventLoop *local_2130;
  _Bind<void_(*(sznet::net::EventLoop_*,_std::_Placeholder<1>))(sznet::net::EventLoop_*,_const_std::shared_ptr<sznet::net::KcpConnection>_&)>
  local_2128;
  undefined1 local_2118 [8];
  KcpCloseCallback cb_1;
  _func_void_shared_ptr<sznet::net::Connector>_ptr *local_20e8;
  type local_20e0;
  TimerCallback local_20c8;
  undefined1 local_20a8 [12];
  Logger local_2098;
  code *local_10c8;
  undefined8 local_10c0;
  type local_10b8;
  Functor local_1078;
  EventLoop *local_1058;
  _Bind<void_(*(sznet::net::EventLoop_*,_std::_Placeholder<1>))(sznet::net::EventLoop_*,_const_std::shared_ptr<sznet::net::TcpConnection>_&)>
  local_1050;
  undefined1 local_1040 [8];
  CloseCallback cb;
  MutexLockGuard lock;
  undefined1 local_1010 [6];
  bool uniqueKcp;
  bool uniqueTcp;
  KcpConnectionPtr kcpConn;
  TcpConnectionPtr tcpConn;
  undefined4 local_fe8;
  Logger local_fe0;
  KcpWithTcpClient *local_10;
  KcpWithTcpClient *this_local;
  
  local_10 = this;
  LVar3 = Logger::logLevel();
  if ((int)LVar3 < 3) {
    Logger::SourceFile::SourceFile<107>
              ((SourceFile *)
               &tcpConn.super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,
               (char (*) [107])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpWithTcpClient.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)tcpConn.
                          super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi;
    file.m_size = local_fe8;
    Logger::Logger(&local_fe0,file,0x3d);
    pLVar4 = Logger::stream(&local_fe0);
    psVar5 = LogStream::operator<<(pLVar4,"KcpWithTcpClient::~KcpWithTcpClient[");
    psVar5 = LogStream::operator<<(psVar5,&this->m_name);
    psVar5 = LogStream::operator<<(psVar5,"] - tcp connector ");
    p = get_pointer<sznet::net::Connector>(&this->m_tcpConnector);
    LogStream::operator<<(psVar5,p);
    Logger::~Logger(&local_fe0);
  }
  std::shared_ptr<sznet::net::TcpConnection>::shared_ptr
            ((shared_ptr<sznet::net::TcpConnection> *)
             &kcpConn.super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::shared_ptr<sznet::net::KcpConnection>::shared_ptr
            ((shared_ptr<sznet::net::KcpConnection> *)local_1010);
  MutexLockGuard::MutexLockGuard((MutexLockGuard *)&cb._M_invoker,&this->m_mutex);
  lVar6 = std::__shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>::use_count
                    (&(this->m_tcpConnection).
                      super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>);
  std::shared_ptr<sznet::net::TcpConnection>::operator=
            ((shared_ptr<sznet::net::TcpConnection> *)
             &kcpConn.super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,&this->m_tcpConnection);
  std::__shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>::use_count
            (&(this->m_kcpConnection).
              super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>);
  std::shared_ptr<sznet::net::KcpConnection>::operator=
            ((shared_ptr<sznet::net::KcpConnection> *)local_1010,&this->m_kcpConnection);
  MutexLockGuard::~MutexLockGuard((MutexLockGuard *)&cb._M_invoker);
  bVar2 = std::__shared_ptr::operator_cast_to_bool
                    ((__shared_ptr *)
                     &kcpConn.
                      super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
  if (bVar2) {
    pEVar1 = this->m_loop;
    peVar8 = std::
             __shared_ptr_access<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&kcpConn.
                              super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount);
    pEVar7 = TcpConnection::getLoop(peVar8);
    if (pEVar1 != pEVar7) {
      __assert_fail("m_loop == tcpConn->getLoop()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpWithTcpClient.cpp"
                    ,0x4e,"sznet::net::KcpWithTcpClient::~KcpWithTcpClient()");
    }
    local_1058 = (EventLoop *)detail::removeTcpConnection;
    std::
    bind<void(*)(sznet::net::EventLoop*,std::shared_ptr<sznet::net::TcpConnection>const&),sznet::net::EventLoop*&,std::_Placeholder<1>const&>
              (&local_1050._M_f,&local_1058,(_Placeholder<1> *)this);
    std::function<void(std::shared_ptr<sznet::net::TcpConnection>const&)>::
    function<std::_Bind<void(*(sznet::net::EventLoop*,std::_Placeholder<1>))(sznet::net::EventLoop*,std::shared_ptr<sznet::net::TcpConnection>const&)>,void>
              ((function<void(std::shared_ptr<sznet::net::TcpConnection>const&)> *)local_1040,
               &local_1050);
    pEVar1 = this->m_loop;
    local_10c8 = TcpConnection::setCloseCallback;
    local_10c0 = 0;
    std::
    bind<void(sznet::net::TcpConnection::*)(std::function<void(std::shared_ptr<sznet::net::TcpConnection>const&)>const&),std::shared_ptr<sznet::net::TcpConnection>&,std::function<void(std::shared_ptr<sznet::net::TcpConnection>const&)>&>
              (&local_10b8,(offset_in_TcpConnection_to_subr *)&local_10c8,
               (shared_ptr<sznet::net::TcpConnection> *)
               &kcpConn.super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,
               (function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)> *)local_1040);
    std::function<void()>::
    function<std::_Bind<void(sznet::net::TcpConnection::*(std::shared_ptr<sznet::net::TcpConnection>,std::function<void(std::shared_ptr<sznet::net::TcpConnection>const&)>))(std::function<void(std::shared_ptr<sznet::net::TcpConnection>const&)>const&)>,void>
              ((function<void()> *)&local_1078,&local_10b8);
    EventLoop::runInLoop(pEVar1,&local_1078);
    std::function<void_()>::~function(&local_1078);
    std::
    _Bind<void_(sznet::net::TcpConnection::*(std::shared_ptr<sznet::net::TcpConnection>,_std::function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)>))(const_std::function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)>_&)>
    ::~_Bind(&local_10b8);
    if (lVar6 == 1) {
      peVar8 = std::
               __shared_ptr_access<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&kcpConn.
                                super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount);
      TcpConnection::forceClose(peVar8);
    }
    std::function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)>::~function
              ((function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)> *)local_1040);
  }
  else {
    LVar3 = Logger::logLevel();
    if ((int)LVar3 < 3) {
      Logger::SourceFile::SourceFile<107>
                ((SourceFile *)local_20a8,
                 (char (*) [107])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpWithTcpClient.cpp"
                );
      file_00._12_4_ = 0;
      file_00.m_data = (char *)local_20a8._0_8_;
      file_00.m_size = local_20a8._8_4_;
      Logger::Logger(&local_2098,file_00,0x5c);
      pLVar4 = Logger::stream(&local_2098);
      LogStream::operator<<(pLVar4,"m_tcpConnector release!!!");
      Logger::~Logger(&local_2098);
    }
    this_00 = std::
              __shared_ptr_access<sznet::net::Connector,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<sznet::net::Connector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->m_tcpConnector);
    Connector::stop(this_00);
    pEVar1 = this->m_loop;
    local_20e8 = detail::removeTcpConnector;
    std::
    bind<void(*)(std::shared_ptr<sznet::net::Connector>const&),std::shared_ptr<sznet::net::Connector>&>
              (&local_20e0,&local_20e8,&this->m_tcpConnector);
    std::function<void()>::
    function<std::_Bind<void(*(std::shared_ptr<sznet::net::Connector>))(std::shared_ptr<sznet::net::Connector>const&)>,void>
              ((function<void()> *)&local_20c8,&local_20e0);
    TVar9 = EventLoop::runAfter(pEVar1,1.0,&local_20c8);
    cb_1._M_invoker = (_Invoker_type)TVar9.m_timer;
    std::function<void_()>::~function(&local_20c8);
    std::
    _Bind<void_(*(std::shared_ptr<sznet::net::Connector>))(const_std::shared_ptr<sznet::net::Connector>_&)>
    ::~_Bind(&local_20e0);
  }
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_1010);
  if (bVar2) {
    pEVar1 = this->m_loop;
    this_01 = std::
              __shared_ptr_access<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_1010);
    pEVar7 = KcpConnection::getLoop(this_01);
    if (pEVar1 != pEVar7) {
      __assert_fail("m_loop == kcpConn->getLoop()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpWithTcpClient.cpp"
                    ,99,"sznet::net::KcpWithTcpClient::~KcpWithTcpClient()");
    }
    local_2130 = (EventLoop *)detail::removeKcpConnection;
    std::
    bind<void(*)(sznet::net::EventLoop*,std::shared_ptr<sznet::net::KcpConnection>const&),sznet::net::EventLoop*&,std::_Placeholder<1>const&>
              (&local_2128._M_f,&local_2130,(_Placeholder<1> *)this);
    std::function<void(std::shared_ptr<sznet::net::KcpConnection>const&,int)>::
    function<std::_Bind<void(*(sznet::net::EventLoop*,std::_Placeholder<1>))(sznet::net::EventLoop*,std::shared_ptr<sznet::net::KcpConnection>const&)>,void>
              ((function<void(std::shared_ptr<sznet::net::KcpConnection>const&,int)> *)local_2118,
               &local_2128);
    pEVar1 = this->m_loop;
    local_21a0 = KcpConnection::setKcpCloseCallback;
    local_2198 = 0;
    std::
    bind<void(sznet::net::KcpConnection::*)(std::function<void(std::shared_ptr<sznet::net::KcpConnection>const&,int)>const&),std::shared_ptr<sznet::net::KcpConnection>&,std::function<void(std::shared_ptr<sznet::net::KcpConnection>const&,int)>&>
              (&local_2190,(offset_in_KcpConnection_to_subr *)&local_21a0,
               (shared_ptr<sznet::net::KcpConnection> *)local_1010,
               (function<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&,_int)> *)
               local_2118);
    std::function<void()>::
    function<std::_Bind<void(sznet::net::KcpConnection::*(std::shared_ptr<sznet::net::KcpConnection>,std::function<void(std::shared_ptr<sznet::net::KcpConnection>const&,int)>))(std::function<void(std::shared_ptr<sznet::net::KcpConnection>const&,int)>const&)>,void>
              ((function<void()> *)&local_2150,&local_2190);
    EventLoop::runInLoop(pEVar1,&local_2150);
    std::function<void_()>::~function(&local_2150);
    std::
    _Bind<void_(sznet::net::KcpConnection::*(std::shared_ptr<sznet::net::KcpConnection>,_std::function<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&,_int)>))(const_std::function<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&,_int)>_&)>
    ::~_Bind(&local_2190);
    if (lVar6 == 1) {
      peVar8 = std::
               __shared_ptr_access<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&kcpConn.
                                super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount);
      TcpConnection::forceClose(peVar8);
    }
    std::function<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&,_int)>::~function
              ((function<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&,_int)> *)
               local_2118);
  }
  else {
    LVar3 = Logger::logLevel();
    if ((int)LVar3 < 3) {
      Logger::SourceFile::SourceFile<107>
                ((SourceFile *)local_3180,
                 (char (*) [107])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpWithTcpClient.cpp"
                );
      file_01._12_4_ = 0;
      file_01.m_data = (char *)local_3180._0_8_;
      file_01.m_size = local_3180._8_4_;
      Logger::Logger(&local_3170,file_01,0x71);
      pLVar4 = Logger::stream(&local_3170);
      LogStream::operator<<(pLVar4,"m_kcpConnector release!!!");
      Logger::~Logger(&local_3170);
    }
  }
  std::shared_ptr<sznet::net::KcpConnection>::~shared_ptr
            ((shared_ptr<sznet::net::KcpConnection> *)local_1010);
  std::shared_ptr<sznet::net::TcpConnection>::~shared_ptr
            ((shared_ptr<sznet::net::TcpConnection> *)
             &kcpConn.super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::shared_ptr<sznet::net::KcpConnection>::~shared_ptr(&this->m_kcpConnection);
  LengthHeaderCodec<std::shared_ptr<sznet::net::TcpConnection>_>::~LengthHeaderCodec
            (&this->m_tcpCodec);
  std::shared_ptr<sznet::net::TcpConnection>::~shared_ptr(&this->m_tcpConnection);
  MutexLock::~MutexLock(&this->m_mutex);
  std::function<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&)>::~function
            (&this->m_kcpWriteCompleteCallback);
  std::
  function<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&,_sznet::net::Buffer_*,_sznet::Timestamp)>
  ::~function(&this->m_kcpMessageCallback);
  std::function<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&)>::~function
            (&this->m_kcpConnectionCallback);
  std::__cxx11::string::~string((string *)&this->m_name);
  std::shared_ptr<sznet::net::Connector>::~shared_ptr(&this->m_tcpConnector);
  return;
}

Assistant:

KcpWithTcpClient::~KcpWithTcpClient()
{
	LOG_INFO << "KcpWithTcpClient::~KcpWithTcpClient[" << m_name 
		<< "] - tcp connector " << get_pointer(m_tcpConnector);
	TcpConnectionPtr tcpConn;
	KcpConnectionPtr kcpConn;
	// TCP & KCP �����Ƿ���KcpWithTcpClient(owner)���Գ���
	bool uniqueTcp = false;
	bool uniqueKcp = false;
	{
		MutexLockGuard lock(m_mutex);
		uniqueTcp = m_tcpConnection.use_count() == 1;
		// TcpClient������Ҫ�����ˣ��ڲ���Ҫ������
		tcpConn = m_tcpConnection;
		uniqueKcp = m_kcpConnection.use_count() == 1;
		kcpConn = m_kcpConnection;
	}
	if (tcpConn)
	{
		assert(m_loop == tcpConn->getLoop());
		// ���������Ƿ����Գ���tcp���ӣ�����Ҫ�����ƺ����ˣ���ֹtcp�����ڴ�й¶
		// FIXME: not 100% safe, if we are in different thread
		CloseCallback cb = std::bind(&detail::removeTcpConnection, m_loop, std::placeholders::_1);
		m_loop->runInLoop(std::bind(&TcpConnection::setCloseCallback, tcpConn, cb));
		// ���Գ��У�ֱ��ǿ�ƹر�
		if (uniqueTcp)
		{
			tcpConn->forceClose();
		}
	}
	// tcp�����Ѿ����ͷ��ˣ���ô���ֵģ�
	else
	{
		LOG_INFO << "m_tcpConnector release!!!";
		m_tcpConnector->stop();
		// FIXME: HACK
		m_loop->runAfter(1, std::bind(&detail::removeTcpConnector, m_tcpConnector));
	}
	if (kcpConn)
	{
		assert(m_loop == kcpConn->getLoop());
		// ���������Ƿ����Գ���tcp���ӣ�����Ҫ�����ƺ����ˣ���ֹtcp�����ڴ�й¶
		// FIXME: not 100% safe, if we are in different thread
		KcpCloseCallback cb = std::bind(&detail::removeKcpConnection, m_loop, std::placeholders::_1);
		m_loop->runInLoop(std::bind(&KcpConnection::setKcpCloseCallback, kcpConn, cb));
		// ���Գ��У�ֱ��ǿ�ƹر�
		if (uniqueTcp)
		{
			tcpConn->forceClose();
		}
	}
	// kcp�����Ѿ����ͷ��ˣ���ô���ֵģ�
	else
	{
		LOG_INFO << "m_kcpConnector release!!!";
	}
}